

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O3

Grand * get_one(void)

{
  int iVar1;
  int iVar2;
  Grand *pGVar3;
  
  iVar1 = rand();
  pGVar3 = (Grand *)operator_new(0x10);
  iVar2 = rand();
  iVar2 = iVar2 % 100;
  if (iVar1 % 3 == 2) {
    iVar1 = rand();
    pGVar3->_hold = iVar2;
    pGVar3->_vptr_Grand = (_func_int **)&PTR_speak_00134c28;
    pGVar3->field_0xc =
         (char)iVar1 +
         ((char)(uint)((ulong)((long)iVar1 * 0x4ec4ec4f) >> 0x23) - (char)(iVar1 >> 0x1f)) * -0x1a +
         'A';
  }
  else if (iVar1 % 3 == 1) {
    pGVar3->_hold = iVar2;
    pGVar3->_vptr_Grand = (_func_int **)&PTR_speak_00134c00;
  }
  else {
    pGVar3->_vptr_Grand = (_func_int **)&PTR_speak_00134be0;
    pGVar3->_hold = iVar2;
  }
  return pGVar3;
}

Assistant:

L15_5::Grand * get_one() {
    using namespace L15_5;

    //  a pointer points to the base class
    Grand * p;
    //  int between 0 and RAND_MAX
    switch(std::rand() % 3) {
        case 0:
            p = new Grand(std::rand() % 100);
            break;
        case 1:
            p = new Superb(std::rand() % 100);
            break;
        case 2:
            p = new Magnificent(std::rand() % 100, 'A' + std::rand() % 26);
            break;
    }

    //  a base-class pointer may actually points to derived class
    return p;
}